

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

void __thiscall QWizardPrivate::updateLayout(QWizardPrivate *this)

{
  QVBoxLayout *pQVar1;
  bool bVar2;
  undefined4 uVar3;
  Int IVar4;
  int iVar5;
  QWizard *subTitle;
  QPixmap *logo;
  QLayout *pQVar6;
  long *plVar7;
  QWizardPrivate *in_RDI;
  long in_FS_OFFSET;
  QSpacerItem *bottomSpacer;
  QLayoutItem *pageItem;
  bool expandPage;
  QWizardPage *page;
  QWizard *q;
  QPixmap pix;
  QWizardLayoutInfo *in_stack_000000e8;
  QWizardPrivate *in_stack_000000f0;
  QWizardLayoutInfo info;
  undefined4 in_stack_fffffffffffffe68;
  Orientation in_stack_fffffffffffffe6c;
  TextFormat in_stack_fffffffffffffe70;
  Policy in_stack_fffffffffffffe74;
  int in_stack_fffffffffffffe78;
  TextFormat in_stack_fffffffffffffe7c;
  QWizardPrivate *in_stack_fffffffffffffe80;
  QWizard *in_stack_fffffffffffffe88;
  QWizardHeader *in_stack_fffffffffffffe90;
  QLabel *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffec0;
  byte in_stack_fffffffffffffec7;
  QWizardPrivate *title;
  QWizardLayoutInfo *in_stack_fffffffffffffee0;
  QWizardHeader *in_stack_fffffffffffffee8;
  QPixmap local_f0 [24];
  QPixmap local_d8 [24];
  undefined1 *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  QPixmap local_a8 [24];
  TextFormat in_stack_ffffffffffffff70;
  TextFormat in_stack_ffffffffffffff78;
  QFlagsStorageHelper<Qt::Orientation,_4> local_44;
  undefined1 local_40 [48];
  byte local_10;
  byte local_f;
  byte local_e;
  byte local_d;
  byte local_b;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  title = in_RDI;
  subTitle = q_func(in_RDI);
  disableUpdates((QWizardPrivate *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  memset(local_40,0xaa,0x38);
  layoutInfoForCurrentPage(in_RDI);
  bVar2 = QWizardLayoutInfo::operator!=
                    ((QWizardLayoutInfo *)
                     CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                     (QWizardLayoutInfo *)
                     CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  if (bVar2) {
    recreateLayout(in_stack_000000f0,in_stack_000000e8);
  }
  logo = (QPixmap *)
         QWizard::currentPage
                   ((QWizard *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  if (logo != (QPixmap *)0x0) {
    pQVar6 = QWidget::layout((QWidget *)0x7b664e);
    in_stack_fffffffffffffec7 = (pQVar6 != (QLayout *)0x0 ^ 0xffU) & 1;
    if ((bool)in_stack_fffffffffffffec7 == false) {
      pQVar1 = in_RDI->pageVBoxLayout;
      uVar3 = (**(code **)(*(long *)&(in_RDI->pageVBoxLayout->super_QBoxLayout).super_QLayout + 0xb8
                          ))(in_RDI->pageVBoxLayout,logo);
      plVar7 = (long *)(**(code **)(*(long *)&(pQVar1->super_QBoxLayout).super_QLayout + 0xa8))
                                 (pQVar1,uVar3);
      (**(code **)(*plVar7 + 0x28))();
      local_44.super_QFlagsStorage<Qt::Orientation>.i =
           (QFlagsStorage<Qt::Orientation>)
           QFlags<Qt::Orientation>::operator&
                     ((QFlags<Qt::Orientation> *)
                      CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                      in_stack_fffffffffffffe6c);
      IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_44);
      in_stack_fffffffffffffec7 = IVar4 != 0;
    }
    in_stack_fffffffffffffe98 = (QLabel *)in_RDI->pageVBoxLayout;
    iVar5 = (**(code **)(*(long *)&(in_RDI->pageVBoxLayout->super_QBoxLayout).super_QLayout + 200))
                      ();
    plVar7 = (long *)(**(code **)(*(long *)&(in_stack_fffffffffffffe98->super_QFrame).super_QWidget
                                 + 0xa8))(in_stack_fffffffffffffe98,iVar5 + -1);
    (**(code **)(*plVar7 + 0x78))();
    QSpacerItem::changeSize
              ((QSpacerItem *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
               in_stack_fffffffffffffe78,in_stack_fffffffffffffe74,in_stack_fffffffffffffe70);
    (**(code **)(*(long *)&(in_RDI->pageVBoxLayout->super_QBoxLayout).super_QLayout + 0x70))();
  }
  if ((local_10 & 1) != 0) {
    in_stack_fffffffffffffe90 = in_RDI->headerWidget;
    QWizardPage::title((QWizardPage *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78))
    ;
    QWizardPage::subTitle
              ((QWizardPage *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    QWizardPage::pixmap((QWizardPage *)in_stack_fffffffffffffe98,
                        (WizardPixmap)((ulong)in_stack_fffffffffffffe90 >> 0x20));
    QWizardPage::pixmap((QWizardPage *)in_stack_fffffffffffffe98,
                        (WizardPixmap)((ulong)in_stack_fffffffffffffe90 >> 0x20));
    in_stack_fffffffffffffe70 = in_RDI->subTitleFmt;
    QWizardHeader::setup
              (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,(QString *)title,
               (QString *)subTitle,logo,
               (QPixmap *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
               in_stack_ffffffffffffff70,in_stack_ffffffffffffff78);
    QPixmap::~QPixmap(local_a8);
    QPixmap::~QPixmap((QPixmap *)&stack0xffffffffffffff70);
    QString::~QString((QString *)0x7b6844);
    QString::~QString((QString *)0x7b6851);
  }
  if (((local_f & 1) != 0) || ((local_b & 1) != 0)) {
    local_c0 = &DAT_aaaaaaaaaaaaaaaa;
    local_b8 = &DAT_aaaaaaaaaaaaaaaa;
    local_b0 = &DAT_aaaaaaaaaaaaaaaa;
    QPixmap::QPixmap((QPixmap *)&local_c0);
    if ((local_f & 1) != 0) {
      if (logo == (QPixmap *)0x0) {
        QWizard::pixmap(in_stack_fffffffffffffe88,
                        (WizardPixmap)((ulong)in_stack_fffffffffffffe80 >> 0x20));
        QPixmap::operator=((QPixmap *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                           (QPixmap *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70))
        ;
        QPixmap::~QPixmap(local_f0);
      }
      else {
        QWizardPage::pixmap((QWizardPage *)in_stack_fffffffffffffe98,
                            (WizardPixmap)((ulong)in_stack_fffffffffffffe90 >> 0x20));
        QPixmap::operator=((QPixmap *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                           (QPixmap *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70))
        ;
        QPixmap::~QPixmap(local_d8);
      }
    }
    QLabel::setPixmap(in_stack_fffffffffffffe98,(QPixmap *)in_stack_fffffffffffffe90);
    QPixmap::~QPixmap((QPixmap *)&local_c0);
  }
  if ((local_e & 1) != 0) {
    QLabel::setTextFormat((QLabel *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
    in_stack_fffffffffffffe88 = (QWizard *)in_RDI->titleLabel;
    QWizardPage::title((QWizardPage *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78))
    ;
    QLabel::setText((QLabel *)in_stack_fffffffffffffe90,(QString *)in_stack_fffffffffffffe88);
    QString::~QString((QString *)0x7b69ae);
  }
  if ((local_d & 1) != 0) {
    QLabel::setTextFormat((QLabel *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
    in_stack_fffffffffffffe80 = (QWizardPrivate *)in_RDI->subTitleLabel;
    QWizardPage::subTitle
              ((QWizardPage *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    QLabel::setText((QLabel *)in_stack_fffffffffffffe90,(QString *)in_stack_fffffffffffffe88);
    QString::~QString((QString *)0x7b6a08);
  }
  enableUpdates((QWizardPrivate *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  updateMinMaxSizes(in_stack_fffffffffffffe80,
                    (QWizardLayoutInfo *)
                    CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizardPrivate::updateLayout()
{
    Q_Q(QWizard);

    disableUpdates();

    QWizardLayoutInfo info = layoutInfoForCurrentPage();
    if (layoutInfo != info)
        recreateLayout(info);
    QWizardPage *page = q->currentPage();

    // If the page can expand vertically, let it stretch "infinitely" more
    // than the QSpacerItem at the bottom. Otherwise, let the QSpacerItem
    // stretch "infinitely" more than the page. Change the bottom item's
    // policy accordingly. The case that the page has no layout is basically
    // for Designer, only.
    if (page) {
        bool expandPage = !page->layout();
        if (!expandPage) {
            const QLayoutItem *pageItem = pageVBoxLayout->itemAt(pageVBoxLayout->indexOf(page));
            expandPage = pageItem->expandingDirections() & Qt::Vertical;
        }
        QSpacerItem *bottomSpacer = pageVBoxLayout->itemAt(pageVBoxLayout->count() -  1)->spacerItem();
        Q_ASSERT(bottomSpacer);
        bottomSpacer->changeSize(0, 0, QSizePolicy::Ignored, expandPage ? QSizePolicy::Ignored : QSizePolicy::MinimumExpanding);
        pageVBoxLayout->invalidate();
    }

    if (info.header) {
        Q_ASSERT(page);
        headerWidget->setup(info, page->title(), page->subTitle(),
                            page->pixmap(QWizard::LogoPixmap), page->pixmap(QWizard::BannerPixmap),
                            titleFmt, subTitleFmt);
    }

    if (info.watermark || info.sideWidget) {
        QPixmap pix;
        if (info.watermark) {
            if (page)
                pix = page->pixmap(QWizard::WatermarkPixmap);
            else
                pix = q->pixmap(QWizard::WatermarkPixmap);
        }
        watermarkLabel->setPixmap(pix); // in case there is no watermark and we show the side widget we need to clear the watermark
    }

    if (info.title) {
        Q_ASSERT(page);
        titleLabel->setTextFormat(titleFmt);
        titleLabel->setText(page->title());
    }
    if (info.subTitle) {
        Q_ASSERT(page);
        subTitleLabel->setTextFormat(subTitleFmt);
        subTitleLabel->setText(page->subTitle());
    }

    enableUpdates();
    updateMinMaxSizes(info);
}